

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

void Dam_ManMultiAig_rec(Dam_Man_t *pMan,Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int *piVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iLit1;
  uint uVar7;
  uint *puVar8;
  ulong uVar9;
  long lVar10;
  
  if (pObj->Value != 0xffffffff) {
    return;
  }
  uVar5 = (uint)*(undefined8 *)pObj;
  if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                  ,0x2f6,
                  "void Dam_ManMultiAig_rec(Dam_Man_t *, Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
LAB_00706448:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar7 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
  if ((int)uVar7 < pMan->vNod2Set->nSize) {
    if ((int)uVar7 < 0) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar4 = pMan->vNod2Set->pArray[uVar7 & 0x7fffffff];
    uVar9 = (ulong)uVar4;
    if (uVar9 != 0) {
      if (((int)uVar4 < 0) || (pMan->vSetStore->nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar3 = pMan->vSetStore->pArray;
      uVar4 = (uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff;
      if ((uVar4 <= (uVar5 & 0x1fffffff)) &&
         (((uVar5 & 0x1fffffff) <= uVar4 ||
          ((p->pMuxes != (uint *)0x0 && (p->pMuxes[uVar7 & 0x7fffffff] != 0)))))) {
        __assert_fail("Gia_ObjIsXor(pObj) || Gia_ObjIsAndReal(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                      ,0x308,
                      "void Dam_ManMultiAig_rec(Dam_Man_t *, Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)"
                     );
      }
      piVar1 = piVar3 + uVar9;
      iVar6 = *piVar1;
      if (0 < iVar6) {
        lVar10 = 0;
        do {
          if (piVar3[uVar9 + lVar10 + 1] < 0) goto LAB_007063cc;
          uVar5 = (uint)piVar3[uVar9 + lVar10 + 1] >> 1;
          if (p->nObjs <= (int)uVar5) goto LAB_007063eb;
          pGVar2 = p->pObjs;
          Dam_ManMultiAig_rec(pMan,pNew,p,pGVar2 + uVar5);
          if (piVar3[uVar9 + lVar10 + 1] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          uVar5 = pGVar2[uVar5].Value;
          if ((int)uVar5 < 0) goto LAB_0070640a;
          piVar3[uVar9 + lVar10 + 1] = piVar3[uVar9 + lVar10 + 1] & 1U ^ uVar5;
          iVar6 = *piVar1;
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar6);
      }
      uVar5 = Gia_ManBalanceGate(pNew,pObj,p->vSuper,piVar1 + 1,iVar6);
      pObj->Value = uVar5;
      return;
    }
  }
  Dam_ManMultiAig_rec(pMan,pNew,p,pObj + -(ulong)(uVar5 & 0x1fffffff));
  Dam_ManMultiAig_rec(pMan,pNew,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_00706448;
  if ((p->pMuxes == (uint *)0x0) ||
     (uVar5 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555], uVar5 == 0))
  {
    uVar9 = *(ulong *)pObj;
    if (((uVar9 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar9 < 0) ||
       (uVar5 = (uint)(uVar9 >> 0x20), (uVar5 & 0x1fffffff) <= ((uint)uVar9 & 0x1fffffff))) {
      iVar6 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar5 = Gia_ManHashAnd(pNew,iVar6,iLit1);
    }
    else {
      if (((int)pObj[-(uVar9 & 0x1fffffff)].Value < 0) ||
         ((int)pObj[-(ulong)(uVar5 & 0x1fffffff)].Value < 0)) goto LAB_0070640a;
      uVar5 = Gia_ManHashXorReal(pNew,pObj[-(uVar9 & 0x1fffffff)].Value ^ (uint)(uVar9 >> 0x1d) & 1,
                                 pObj[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
    }
  }
  else {
    if ((int)uVar5 < 0) goto LAB_007063cc;
    if (p->nObjs <= (int)(uVar5 >> 1)) goto LAB_007063eb;
    Dam_ManMultiAig_rec(pMan,pNew,p,pGVar2 + (uVar5 >> 1));
    if (p->pMuxes == (uint *)0x0) {
      uVar5 = 0;
      puVar8 = (uint *)&DAT_00000008;
    }
    else {
      pGVar2 = p->pObjs;
      if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_00706448;
      uVar5 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555];
      if ((int)uVar5 < 0) goto LAB_007063cc;
      if (p->nObjs <= (int)(uVar5 >> 1)) goto LAB_007063eb;
      puVar8 = &pGVar2[uVar5 >> 1].Value;
      uVar5 = uVar5 & 1;
    }
    if ((int)*puVar8 < 0) {
LAB_0070640a:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    uVar7 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
    if ((int)pObj[-(ulong)(uVar7 & 0x1fffffff)].Value < 0) goto LAB_0070640a;
    uVar4 = (uint)*(undefined8 *)pObj;
    if ((int)pObj[-(ulong)(uVar4 & 0x1fffffff)].Value < 0) goto LAB_0070640a;
    uVar5 = Gia_ManHashMuxReal(pNew,*puVar8 ^ uVar5,
                               uVar7 >> 0x1d & 1 ^ pObj[-(ulong)(uVar7 & 0x1fffffff)].Value,
                               pObj[-(ulong)(uVar4 & 0x1fffffff)].Value ^ uVar4 >> 0x1d & 1);
  }
  pObj->Value = uVar5;
  if (-1 < (int)uVar5) {
    if ((int)(uVar5 >> 1) < pNew->nObjs) {
      Gia_ObjSetGateLevel(pNew,pNew->pObjs + (uVar5 >> 1));
      return;
    }
LAB_007063eb:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_007063cc:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

void Dam_ManMultiAig_rec( Dam_Man_t * pMan, Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int i, * pSet;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    pSet = Dam_ObjSet(pMan, Gia_ObjId(p, pObj));
    if ( pSet == NULL )
    {
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin0(pObj) );
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin1(pObj) );
        if ( Gia_ObjIsMux(p, pObj) )
        {
            Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin2(p, pObj) );
            pObj->Value = Gia_ManHashMuxReal( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        }
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value)) );
        return;
    }
    assert( Gia_ObjIsXor(pObj) || Gia_ObjIsAndReal(p, pObj) );
    // call recursively
    for ( i = 1; i <= pSet[0]; i++ )
    {
        Gia_Obj_t * pTemp = Gia_ManObj( p, Abc_Lit2Var(pSet[i]) );
        Dam_ManMultiAig_rec( pMan, pNew, p, pTemp );
        pSet[i] = Abc_LitNotCond( pTemp->Value, Abc_LitIsCompl(pSet[i]) );
    }
    // create balanced gate
    pObj->Value = Gia_ManBalanceGate( pNew, pObj, p->vSuper, pSet + 1, pSet[0] );
}